

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzer.cpp
# Opt level: O0

void __thiscall SWDAnalyzer::SetupResults(SWDAnalyzer *this)

{
  SWDAnalyzerResults *this_00;
  element_type *peVar1;
  SWDAnalyzer *this_local;
  
  this_00 = (SWDAnalyzerResults *)operator_new(0x20);
  SWDAnalyzerResults::SWDAnalyzerResults(this_00,this,&this->mSettings);
  std::auto_ptr<SWDAnalyzerResults>::reset(&this->mResults,this_00);
  std::auto_ptr<SWDAnalyzerResults>::get(&this->mResults);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  peVar1 = std::auto_ptr<SWDAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)peVar1);
  peVar1 = std::auto_ptr<SWDAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)peVar1);
  return;
}

Assistant:

void SWDAnalyzer::SetupResults()
{
    // reset the results
    mResults.reset( new SWDAnalyzerResults( this, &mSettings ) );
    SetAnalyzerResults( mResults.get() );

    // set which channels will carry bubbles
    mResults->AddChannelBubblesWillAppearOn( mSettings.mSWDIO );
    mResults->AddChannelBubblesWillAppearOn( mSettings.mSWCLK );
}